

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O2

ON_ModelComponentReference __thiscall
ONX_Model::RemoveModelComponent(ONX_Model *this,Type component_type,ON_UUID component_id)

{
  ON__UINT8 OVar1;
  ON__UINT16 OVar2;
  bool bVar3;
  Type TVar4;
  ON_ComponentManifestItem *pOVar5;
  ON__UINT64 model_component_runtime_serial_number;
  ONX_ModelComponentReferenceLink *mcr_link;
  long lVar6;
  char *sFormat;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  int line_number;
  undefined7 in_register_00000031;
  ONX_Model *this_00;
  ON_ComponentManifestItem *pOVar8;
  uchar in_R8 [8];
  byte bVar9;
  ON_UUID OVar10;
  ON_ModelComponentReference OVar11;
  ON_ComponentManifestItem item;
  
  this_00 = (ONX_Model *)CONCAT71(in_register_00000031,component_type);
  bVar9 = 0;
  OVar10.Data4 = in_R8;
  OVar10._0_8_ = component_id.Data4;
  pOVar5 = ON_ComponentManifest::ItemFromId(&this_00->m_manifest,OVar10);
  pOVar8 = &item;
  for (lVar6 = 10; lVar6 != 0; lVar6 = lVar6 + -1) {
    TVar4 = pOVar5->m_component_type;
    OVar1 = pOVar5->m_reserved1;
    OVar2 = pOVar5->m_reserved2;
    pOVar8->m_status_bits = pOVar5->m_status_bits;
    pOVar8->m_component_type = TVar4;
    pOVar8->m_reserved1 = OVar1;
    pOVar8->m_reserved2 = OVar2;
    pOVar5 = (ON_ComponentManifestItem *)((long)pOVar5 + (ulong)bVar9 * -0x10 + 8);
    pOVar8 = (ON_ComponentManifestItem *)((long)pOVar8 + (ulong)bVar9 * -0x10 + 8);
  }
  bVar3 = ON_ComponentManifestItem::IsUnset(&item);
  if (bVar3) {
    sFormat = "Invalid component_id parameter.";
    line_number = 0x47a;
  }
  else {
    if ((Type)component_id.Data1 != Unset) {
      TVar4 = ON_ComponentManifestItem::ComponentType(&item);
      if (TVar4 != (Type)component_id.Data1) {
        sFormat = "Invalid model_component type.";
        line_number = 0x47f;
        goto LAB_00483537;
      }
    }
    OVar10 = ON_ComponentManifestItem::Id(&item);
    bVar3 = ON_ComponentManifest::RemoveComponent(&this_00->m_manifest,OVar10);
    if (bVar3) {
      model_component_runtime_serial_number =
           ON_ComponentManifestItem::ComponentRuntimeSerialNumber(&item);
      mcr_link = Internal_ModelComponentLinkFromSerialNumber
                           (this_00,model_component_runtime_serial_number);
      if (mcr_link != (ONX_ModelComponentReferenceLink *)0x0) {
        ON_ModelComponentReference::ON_ModelComponentReference
                  ((ON_ModelComponentReference *)this,&mcr_link->m_mcr);
        Internal_RemoveModelComponentReferenceLink(this_00,mcr_link);
        _Var7._M_pi = extraout_RDX;
        goto LAB_0048354d;
      }
      sFormat = "component not in model.";
      line_number = 0x48b;
    }
    else {
      sFormat = "Unable to remove component from manifest.";
      line_number = 0x484;
    }
  }
LAB_00483537:
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_extensions.cpp"
             ,line_number,"",sFormat);
  ON_ModelComponentReference::ON_ModelComponentReference
            ((ON_ModelComponentReference *)this,&ON_ModelComponentReference::Empty);
  _Var7._M_pi = extraout_RDX_00;
LAB_0048354d:
  OVar11.m_sp.super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var7._M_pi;
  OVar11.m_sp.super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ON_ModelComponentReference)
         OVar11.m_sp.super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ON_ModelComponentReference ONX_Model::RemoveModelComponent(
  ON_ModelComponent::Type component_type,
  ON_UUID component_id
  )
{
  const ON_ComponentManifestItem item = m_manifest.ItemFromId(component_id);
  if (item.IsUnset())
  {
    ON_ERROR("Invalid component_id parameter.");
    return ON_ModelComponentReference::Empty;
  }
  if (ON_ModelComponent::Type::Unset != component_type && component_type != item.ComponentType())
  {
    ON_ERROR("Invalid model_component type.");
    return ON_ModelComponentReference::Empty;
  }
  if (!m_manifest.RemoveComponent(item.Id()))
  {
    ON_ERROR("Unable to remove component from manifest.");
    return ON_ModelComponentReference::Empty;
  }

  ONX_ModelComponentReferenceLink* mcr_link = Internal_ModelComponentLinkFromSerialNumber(item.ComponentRuntimeSerialNumber());
  if (nullptr == mcr_link)
  {
    ON_ERROR("component not in model.");
    return ON_ModelComponentReference::Empty;
  }
  ON_ModelComponentReference mcr = mcr_link->m_mcr;
  Internal_RemoveModelComponentReferenceLink(mcr_link);
  return mcr;
}